

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# istreamwrapper.h
# Opt level: O1

void __thiscall
rapidjson::BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Read
          (BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_> *this)

{
  Ch *pCVar1;
  size_t sVar2;
  long *plVar3;
  
  if (this->current_ < this->bufferLast_) {
    this->current_ = this->current_ + 1;
  }
  else if (this->eof_ == false) {
    this->count_ = this->count_ + this->readCount_;
    this->readCount_ = this->bufferSize_;
    pCVar1 = this->buffer_;
    this->bufferLast_ = pCVar1 + (this->bufferSize_ - 1);
    this->current_ = pCVar1;
    plVar3 = (long *)std::istream::read((char *)this->stream_,(long)pCVar1);
    if ((*(byte *)((long)plVar3 + *(long *)(*plVar3 + -0x18) + 0x20) & 5) != 0) {
      sVar2 = this->stream_->_M_gcount;
      this->readCount_ = sVar2;
      this->bufferLast_ = this->buffer_ + sVar2;
      this->buffer_[sVar2] = '\0';
      this->eof_ = true;
    }
  }
  return;
}

Assistant:

void Read() {
        if (current_ < bufferLast_)
            ++current_;
        else if (!eof_) {
            count_ += readCount_;
            readCount_ = bufferSize_;
            bufferLast_ = buffer_ + readCount_ - 1;
            current_ = buffer_;

            if (!stream_.read(buffer_, static_cast<std::streamsize>(bufferSize_))) {
                readCount_ = static_cast<size_t>(stream_.gcount());
                *(bufferLast_ = buffer_ + readCount_) = '\0';
                eof_ = true;
            }
        }
    }